

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperCanon.c
# Opt level: O3

int Map_CanonComputeFast
              (Map_Man_t *p,int nVarsMax,int nVarsReal,uint *uTruth,uchar *puPhases,uint *uTruthRes)

{
  char cVar1;
  ushort uVar2;
  ushort uVar3;
  unsigned_short *puVar4;
  char cVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  byte bVar11;
  uint uVar12;
  uint uVar13;
  
  if (nVarsMax == 6) {
    iVar6 = Map_CanonComputeSlow(p->uTruths,6,nVarsReal,uTruth,puPhases,uTruthRes);
    return iVar6;
  }
  if (nVarsReal < 5) {
    uVar2 = (ushort)*uTruth;
    if (p->pCounters[uVar2] < '\x01') {
      __assert_fail("p->pCounters[uTruth0] > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperCanon.c"
                    ,0xbc,
                    "int Map_CanonComputeFast(Map_Man_t *, int, int, unsigned int *, unsigned char *, unsigned int *)"
                   );
    }
    uVar8 = CONCAT22(p->uCanons[uVar2],p->uCanons[uVar2]);
    *uTruthRes = uVar8;
    uTruthRes[1] = uVar8;
    *puPhases = *p->uPhases[uVar2];
  }
  else {
    if (nVarsMax != 5) {
      __assert_fail("nVarsMax == 5",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperCanon.c"
                    ,0xc3,
                    "int Map_CanonComputeFast(Map_Man_t *, int, int, unsigned int *, unsigned char *, unsigned int *)"
                   );
    }
    if (nVarsReal != 5) {
      __assert_fail("nVarsReal == 5",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperCanon.c"
                    ,0xc4,
                    "int Map_CanonComputeFast(Map_Man_t *, int, int, unsigned int *, unsigned char *, unsigned int *)"
                   );
    }
    uVar8 = *uTruth;
    uVar12 = uVar8 & 0xffff;
    if (uVar8 < 0x10000) {
      uVar2 = p->uCanons[uVar12];
      *uTruthRes = (uint)uVar2;
      uTruthRes[1] = (uint)uVar2;
      cVar1 = p->pCounters[uVar12];
      cVar5 = '\x04';
      if (cVar1 < '\x04') {
        cVar5 = cVar1;
      }
      uVar8 = (uint)cVar5;
      if (cVar1 < '\x01') {
        return uVar8;
      }
      uVar9 = 0;
      do {
        puPhases[uVar9] = p->uPhases[uVar12][uVar9];
        uVar9 = uVar9 + 1;
      } while (uVar8 != uVar9);
      return uVar8;
    }
    uVar8 = uVar8 >> 0x10;
    puVar4 = p->uCanons;
    if (uVar12 == 0) {
      uVar2 = puVar4[uVar8];
      *uTruthRes = (uint)uVar2;
      uTruthRes[1] = (uint)uVar2;
      cVar1 = p->pCounters[uVar8];
      cVar5 = '\x04';
      if (cVar1 < '\x04') {
        cVar5 = cVar1;
      }
      uVar12 = (uint)cVar5;
      if (cVar1 < '\x01') {
        return uVar12;
      }
      uVar9 = 0;
      do {
        puPhases[uVar9] = p->uPhases[uVar8][uVar9] | 0x10;
        uVar9 = uVar9 + 1;
      } while (uVar12 != uVar9);
      return uVar12;
    }
    uVar2 = puVar4[uVar12];
    uVar3 = puVar4[uVar8];
    if (uVar2 < uVar3) {
      if (p->pCounters[uVar12] < '\x01') {
        __assert_fail("p->pCounters[uTruth0] > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperCanon.c"
                      ,0xf3,
                      "int Map_CanonComputeFast(Map_Man_t *, int, int, unsigned int *, unsigned char *, unsigned int *)"
                     );
      }
      uVar13 = 0xffffffff;
      bVar11 = 0x10;
      lVar10 = 0;
      do {
        uVar7 = Extra_TruthPolarize(uVar8,(int)p->uPhases[uVar12][lVar10],4);
        if ((uVar7 < uVar13) && (bVar11 = p->uPhases[uVar12][lVar10], uVar13 = uVar7, 0xf < bVar11))
        {
          __assert_fail("uPhaseBest < 16",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperCanon.c"
                        ,0xfc,
                        "int Map_CanonComputeFast(Map_Man_t *, int, int, unsigned int *, unsigned char *, unsigned int *)"
                       );
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 < p->pCounters[uVar12]);
      uVar13 = uVar13 | (uint)uVar2 << 0x10;
      *uTruthRes = uVar13;
      uTruthRes[1] = uVar13;
      bVar11 = bVar11 | 0x10;
    }
    else {
      if (p->pCounters[uVar8] < '\x01') {
        __assert_fail("p->pCounters[uTruth1] > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperCanon.c"
                      ,0xe0,
                      "int Map_CanonComputeFast(Map_Man_t *, int, int, unsigned int *, unsigned char *, unsigned int *)"
                     );
      }
      uVar13 = 0xffffffff;
      bVar11 = 0x10;
      lVar10 = 0;
      do {
        uVar7 = Extra_TruthPolarize(uVar12,(int)p->uPhases[uVar8][lVar10],4);
        if ((uVar7 < uVar13) && (bVar11 = p->uPhases[uVar8][lVar10], uVar13 = uVar7, 0xf < bVar11))
        {
          __assert_fail("uPhaseBest < 16",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperCanon.c"
                        ,0xe9,
                        "int Map_CanonComputeFast(Map_Man_t *, int, int, unsigned int *, unsigned char *, unsigned int *)"
                       );
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 < p->pCounters[uVar8]);
      uVar13 = uVar13 | (uint)uVar3 << 0x10;
      *uTruthRes = uVar13;
      uTruthRes[1] = uVar13;
    }
    *puPhases = bVar11;
  }
  return 1;
}

Assistant:

int Map_CanonComputeFast( Map_Man_t * p, int nVarsMax, int nVarsReal, unsigned uTruth[], unsigned char * puPhases, unsigned uTruthRes[] )
{
    unsigned uTruth0, uTruth1;
    unsigned uCanon0, uCanon1, uCanonBest;
    unsigned uPhaseBest = 16; // Suppress "might be used uninitialized" (asserts require < 16)
    int i, Limit;

    if ( nVarsMax == 6 )
        return Map_CanonComputeSlow( p->uTruths, nVarsMax, nVarsReal, uTruth, puPhases, uTruthRes );

    if ( nVarsReal < 5 )
    {
//        return Map_CanonComputeSlow( p->uTruths, nVarsMax, nVarsReal, uTruth, puPhases, uTruthRes );

        uTruth0 = uTruth[0] & 0xFFFF;
        assert( p->pCounters[uTruth0] > 0 );
        uTruthRes[0] = (p->uCanons[uTruth0] << 16) | p->uCanons[uTruth0];
        uTruthRes[1] = uTruthRes[0];
        puPhases[0] = p->uPhases[uTruth0][0];
        return 1;
    }

    assert( nVarsMax == 5 );
    assert( nVarsReal == 5 );
    uTruth0 = uTruth[0] & 0xFFFF;
    uTruth1 = (uTruth[0] >> 16);
    if ( uTruth1 == 0 )
    {
        uTruthRes[0] = p->uCanons[uTruth0];
        uTruthRes[1] = uTruthRes[0];
        Limit = (p->pCounters[uTruth0] > 4)? 4 : p->pCounters[uTruth0];
        for ( i = 0; i < Limit; i++ )
            puPhases[i] = p->uPhases[uTruth0][i];
        return Limit;
    }
    else if ( uTruth0 == 0 )
    {
        uTruthRes[0] = p->uCanons[uTruth1];
        uTruthRes[1] = uTruthRes[0];
        Limit = (p->pCounters[uTruth1] > 4)? 4 : p->pCounters[uTruth1];
        for ( i = 0; i < Limit; i++ )
        {
            puPhases[i] = p->uPhases[uTruth1][i];
            puPhases[i] |= (1 << 4);
        }
        return Limit;
    }
    uCanon0 = p->uCanons[uTruth0];
    uCanon1 = p->uCanons[uTruth1];
    if ( uCanon0 >= uCanon1 ) // using nCanon1 as the main one
    {
        assert( p->pCounters[uTruth1] > 0 );
        uCanonBest = 0xFFFFFFFF;
        for ( i = 0; i < p->pCounters[uTruth1]; i++ )
        {
            uCanon0 = Extra_TruthPolarize( uTruth0, p->uPhases[uTruth1][i], 4 );
            if ( uCanonBest > uCanon0 )
            {
                uCanonBest = uCanon0;
                uPhaseBest = p->uPhases[uTruth1][i];
                assert( uPhaseBest < 16 );
            }
        }
        uTruthRes[0] = (uCanon1 << 16) | uCanonBest;
        uTruthRes[1] = uTruthRes[0];
        puPhases[0] = uPhaseBest;
        return 1;
    }
    else if ( uCanon0 < uCanon1 )
    {
        assert( p->pCounters[uTruth0] > 0 );
        uCanonBest = 0xFFFFFFFF;
        for ( i = 0; i < p->pCounters[uTruth0]; i++ )
        {
            uCanon1 = Extra_TruthPolarize( uTruth1, p->uPhases[uTruth0][i], 4 );
            if ( uCanonBest > uCanon1 )
            {
                uCanonBest = uCanon1;
                uPhaseBest = p->uPhases[uTruth0][i];
                assert( uPhaseBest < 16 );
            }
        }
        uTruthRes[0] = (uCanon0 << 16) | uCanonBest;
        uTruthRes[1] = uTruthRes[0];
        puPhases[0] = uPhaseBest | (1 << 4);
        return 1;
    }
    else
    {
        assert( 0 );
        return Map_CanonComputeSlow( p->uTruths, nVarsMax, nVarsReal, uTruth, puPhases, uTruthRes );
    }
}